

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::parse_declaration_encoding
               (uint8_t *data,size_t size,uint8_t **out_encoding,size_t *out_length)

{
  ulong uVar1;
  bool bVar2;
  uint8_t local_54;
  size_t start;
  ulong uStack_40;
  uint8_t delimiter;
  size_t offset;
  size_t i;
  size_t *out_length_local;
  uint8_t **out_encoding_local;
  size_t size_local;
  uint8_t *data_local;
  
  if (((5 < size) &&
      ((((*data == '<' && data[1] == '?') && data[2] == 'x') && data[3] == 'm') && data[4] == 'l'))
     && (((anonymous_namespace)::chartype_table[data[5]] & 8) != 0)) {
    for (offset = 6; offset + 1 < size; offset = offset + 1) {
      if (data[offset] == '?') {
        return false;
      }
      if ((data[offset] == 'e') && (data[offset + 1] == 'n')) {
        if ((size <= offset) || (data[offset] != 'e')) {
          return false;
        }
        if ((size <= offset + 1) || (data[offset + 1] != 'n')) {
          return false;
        }
        if ((size <= offset + 2) || (data[offset + 2] != 'c')) {
          return false;
        }
        if ((size <= offset + 3) || (data[offset + 3] != 'o')) {
          return false;
        }
        if ((size <= offset + 4) || (data[offset + 4] != 'd')) {
          return false;
        }
        if ((size <= offset + 5) || (data[offset + 5] != 'i')) {
          return false;
        }
        if ((offset + 6 < size) && (data[offset + 6] == 'n')) {
          if ((size <= offset + 7) || (data[offset + 7] != 'g')) {
            return false;
          }
          uStack_40 = offset + 8;
          while( true ) {
            bVar2 = false;
            if (uStack_40 < size) {
              bVar2 = ((anonymous_namespace)::chartype_table[data[uStack_40]] & 8) != 0;
            }
            if (!bVar2) break;
            uStack_40 = uStack_40 + 1;
          }
          if ((uStack_40 < size) && (data[uStack_40] == '=')) {
            do {
              uVar1 = uStack_40;
              uStack_40 = uVar1 + 1;
              bVar2 = false;
              if (uStack_40 < size) {
                bVar2 = ((anonymous_namespace)::chartype_table[data[uStack_40]] & 8) != 0;
              }
            } while (bVar2);
            bVar2 = false;
            if (uStack_40 < size) {
              bVar2 = data[uStack_40] == '\"';
            }
            local_54 = '\"';
            if (!bVar2) {
              local_54 = '\'';
            }
            if ((uStack_40 < size) && (data[uStack_40] == local_54)) {
              uVar1 = uVar1 + 2;
              *out_encoding = data + uVar1;
              uStack_40 = uVar1;
              while( true ) {
                bVar2 = false;
                if (uStack_40 < size) {
                  bVar2 = ((anonymous_namespace)::chartype_table[data[uStack_40]] & 0x40) != 0;
                }
                if (!bVar2) break;
                uStack_40 = uStack_40 + 1;
              }
              *out_length = uStack_40 - uVar1;
              if ((uStack_40 < size) && (data[uStack_40] == local_54)) {
                return true;
              }
              return false;
            }
            return false;
          }
          return false;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

PUGI_IMPL_FN bool parse_declaration_encoding(const uint8_t* data, size_t size, const uint8_t*& out_encoding, size_t& out_length)
	{
	#define PUGI_IMPL_SCANCHAR(ch) { if (offset >= size || data[offset] != ch) return false; offset++; }
	#define PUGI_IMPL_SCANCHARTYPE(ct) { while (offset < size && PUGI_IMPL_IS_CHARTYPE(data[offset], ct)) offset++; }

		// check if we have a non-empty XML declaration
		if (size < 6 || !((data[0] == '<') & (data[1] == '?') & (data[2] == 'x') & (data[3] == 'm') & (data[4] == 'l') && PUGI_IMPL_IS_CHARTYPE(data[5], ct_space)))
			return false;

		// scan XML declaration until the encoding field
		for (size_t i = 6; i + 1 < size; ++i)
		{
			// declaration can not contain ? in quoted values
			if (data[i] == '?')
				return false;

			if (data[i] == 'e' && data[i + 1] == 'n')
			{
				size_t offset = i;

				// encoding follows the version field which can't contain 'en' so this has to be the encoding if XML is well formed
				PUGI_IMPL_SCANCHAR('e'); PUGI_IMPL_SCANCHAR('n'); PUGI_IMPL_SCANCHAR('c'); PUGI_IMPL_SCANCHAR('o');
				PUGI_IMPL_SCANCHAR('d'); PUGI_IMPL_SCANCHAR('i'); PUGI_IMPL_SCANCHAR('n'); PUGI_IMPL_SCANCHAR('g');

				// S? = S?
				PUGI_IMPL_SCANCHARTYPE(ct_space);
				PUGI_IMPL_SCANCHAR('=');
				PUGI_IMPL_SCANCHARTYPE(ct_space);

				// the only two valid delimiters are ' and "
				uint8_t delimiter = (offset < size && data[offset] == '"') ? '"' : '\'';

				PUGI_IMPL_SCANCHAR(delimiter);

				size_t start = offset;

				out_encoding = data + offset;

				PUGI_IMPL_SCANCHARTYPE(ct_symbol);

				out_length = offset - start;

				PUGI_IMPL_SCANCHAR(delimiter);

				return true;
			}
		}

		return false;

	#undef PUGI_IMPL_SCANCHAR
	#undef PUGI_IMPL_SCANCHARTYPE
	}